

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O1

void __thiscall
PlanTest::FindWorkSorted(PlanTest *this,deque<Edge_*,_std::allocator<Edge_*>_> *ret,int count)

{
  iterator *piVar1;
  _Elt_pointer ppEVar2;
  _Elt_pointer ppEVar3;
  _Elt_pointer ppEVar4;
  _Elt_pointer ppEVar5;
  _Map_pointer pppEVar6;
  _Elt_pointer ppEVar7;
  _Elt_pointer ppEVar8;
  _Map_pointer pppEVar9;
  long lVar10;
  Test *this_00;
  bool bVar11;
  bool bVar12;
  Edge *pEVar13;
  ulong uVar14;
  int iVar15;
  Edge *edge;
  _Deque_iterator<Edge_*,_Edge_*&,_Edge_**> local_b0;
  _Deque_iterator<Edge_*,_Edge_*&,_Edge_**> local_90;
  _Deque_iterator<Edge_*,_Edge_*&,_Edge_**> local_70;
  _Deque_iterator<Edge_*,_Edge_*&,_Edge_**> local_50;
  
  bVar12 = 0 < count;
  if (0 < count) {
    iVar15 = 1;
    do {
      bVar11 = testing::Test::Check
                         (g_current_test,
                          0 < (this->plan_).command_edges_ && 0 < (this->plan_).wanted_edges_,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                          ,0x2b,"plan_.more_to_do()");
      if (!bVar11) {
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_0013b008:
        if (bVar12) {
          return;
        }
        break;
      }
      local_b0._M_cur = (_Elt_pointer)Plan::FindWork(&this->plan_);
      bVar11 = testing::Test::Check
                         (g_current_test,(Edge *)local_b0._M_cur != (Edge *)0x0,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                          ,0x2d,"edge");
      if (bVar11) {
        ppEVar2 = (ret->super__Deque_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.
                  super__Deque_impl_data._M_finish._M_cur;
        if (ppEVar2 ==
            (ret->super__Deque_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.super__Deque_impl_data
            ._M_finish._M_last + -1) {
          std::deque<Edge*,std::allocator<Edge*>>::_M_push_back_aux<Edge*const&>
                    ((deque<Edge*,std::allocator<Edge*>> *)ret,(Edge **)&local_b0);
        }
        else {
          *ppEVar2 = (Edge *)local_b0._M_cur;
          piVar1 = &(ret->super__Deque_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.
                    super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
      }
      else {
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      }
      if (!bVar11) goto LAB_0013b008;
      bVar12 = iVar15 < count;
      bVar11 = iVar15 != count;
      iVar15 = iVar15 + 1;
    } while (bVar11);
  }
  this_00 = g_current_test;
  pEVar13 = Plan::FindWork(&this->plan_);
  bVar12 = testing::Test::Check
                     (this_00,pEVar13 == (Edge *)0x0,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                      ,0x30,"plan_.FindWork()");
  if (bVar12) {
    ppEVar2 = (ret->super__Deque_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    ppEVar3 = (ret->super__Deque_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (ppEVar2 != ppEVar3) {
      ppEVar4 = (ret->super__Deque_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.
                super__Deque_impl_data._M_start._M_first;
      ppEVar5 = (ret->super__Deque_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.
                super__Deque_impl_data._M_start._M_last;
      pppEVar6 = (ret->super__Deque_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_node;
      ppEVar7 = (ret->super__Deque_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.
                super__Deque_impl_data._M_finish._M_first;
      ppEVar8 = (ret->super__Deque_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.
                super__Deque_impl_data._M_finish._M_last;
      pppEVar9 = (ret->super__Deque_base<Edge_*,_std::allocator<Edge_*>_>)._M_impl.
                 super__Deque_impl_data._M_finish._M_node;
      uVar14 = ((long)ppEVar5 - (long)ppEVar2 >> 3) + ((long)ppEVar3 - (long)ppEVar7 >> 3) +
               ((((ulong)((long)pppEVar9 - (long)pppEVar6) >> 3) - 1) +
               (ulong)(pppEVar9 == (_Map_pointer)0x0)) * 0x40;
      lVar10 = 0x3f;
      if (uVar14 != 0) {
        for (; uVar14 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      local_b0._M_cur = ppEVar2;
      local_b0._M_first = ppEVar4;
      local_b0._M_last = ppEVar5;
      local_b0._M_node = pppEVar6;
      local_50._M_cur = ppEVar3;
      local_50._M_first = ppEVar7;
      local_50._M_last = ppEVar8;
      local_50._M_node = pppEVar9;
      std::
      __introsort_loop<std::_Deque_iterator<Edge*,Edge*&,Edge**>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Edge_const*,Edge_const*)>>
                (&local_b0,&local_50,(ulong)(((uint)lVar10 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(const_Edge_*,_const_Edge_*)>)0x13b1ce);
      local_90._M_cur = ppEVar3;
      local_90._M_first = ppEVar7;
      local_90._M_last = ppEVar8;
      local_90._M_node = pppEVar9;
      local_70._M_cur = ppEVar2;
      local_70._M_first = ppEVar4;
      local_70._M_last = ppEVar5;
      local_70._M_node = pppEVar6;
      std::
      __final_insertion_sort<std::_Deque_iterator<Edge*,Edge*&,Edge**>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Edge_const*,Edge_const*)>>
                (&local_70,&local_90,(_Iter_comp_iter<bool_(*)(const_Edge_*,_const_Edge_*)>)0x13b1ce
                );
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

void FindWorkSorted(deque<Edge*>* ret, int count) {
    for (int i = 0; i < count; ++i) {
      ASSERT_TRUE(plan_.more_to_do());
      Edge* edge = plan_.FindWork();
      ASSERT_TRUE(edge);
      ret->push_back(edge);
    }
    ASSERT_FALSE(plan_.FindWork());
    sort(ret->begin(), ret->end(), CompareEdgesByOutput::cmp);
  }